

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

ostream * std::operator<<(ostream *o,StackInst *inst)

{
  ostream *poVar1;
  StackInst *inst_local;
  ostream *o_local;
  
  poVar1 = ::wasm::printStackInst(inst,o,(Function *)0x0);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& o, wasm::StackInst& inst) {
  return wasm::printStackInst(&inst, o);
}